

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# system_catalog.cpp
# Opt level: O0

void __thiscall SystemCatalog::listTypes(SystemCatalog *this,ostream *stream)

{
  bool bVar1;
  reference ptVar2;
  ostream *this_00;
  type *type;
  iterator __end1;
  iterator __begin1;
  set<type,_std::less<type>,_std::allocator<type>_> *__range1;
  ostream *stream_local;
  SystemCatalog *this_local;
  
  __end1 = std::set<type,_std::less<type>,_std::allocator<type>_>::begin(&this->types);
  type = (type *)std::set<type,_std::less<type>,_std::allocator<type>_>::end(&this->types);
  while( true ) {
    bVar1 = std::operator!=(&__end1,(_Self *)&type);
    if (!bVar1) break;
    ptVar2 = std::_Rb_tree_const_iterator<type>::operator*(&__end1);
    this_00 = std::operator<<(stream,(string *)ptVar2);
    std::ostream::operator<<(this_00,std::endl<char,std::char_traits<char>>);
    std::_Rb_tree_const_iterator<type>::operator++(&__end1);
  }
  return;
}

Assistant:

void SystemCatalog::listTypes(ostream &stream) {

    for (const auto &type : this->types) {
        stream << type.typeName << endl;
    }
}